

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip39.c
# Opt level: O3

int bip39_get_wordlist(char *lang,words **output)

{
  int iVar1;
  long lVar2;
  
  if (output == (words **)0x0) {
    return -2;
  }
  *output = &en_words;
  if (lang != (char *)0x0) {
    lVar2 = 0;
    do {
      iVar1 = strcmp(lang,lookup[0].name + lVar2);
      if (iVar1 == 0) {
        *output = *(words **)(lookup[0].name + lVar2 + 8);
        return 0;
      }
      lVar2 = lVar2 + 0x10;
    } while (lVar2 != 0x70);
  }
  return 0;
}

Assistant:

int bip39_get_wordlist(const char *lang, struct words **output)
{
    size_t i;

    if (!output)
        return WALLY_EINVAL;

    *output = (struct words *)&en_words; /* Fallback to English if not found */

    if (lang)
        for (i = 0; i < sizeof(lookup) / sizeof(lookup[0]); ++i)
            if (!strcmp(lang, lookup[i].name)) {
                *output = (struct words *)lookup[i].words;
                break;
            }
    return WALLY_OK;
}